

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImageSetStyle(gdImagePtr im,int *style,int noOfPixels)

{
  int iVar1;
  int *piVar2;
  int noOfPixels_local;
  int *style_local;
  gdImagePtr im_local;
  
  if (im->style != (int *)0x0) {
    gdFree(im->style);
  }
  iVar1 = overflow2(4,noOfPixels);
  if (iVar1 == 0) {
    piVar2 = (int *)gdMalloc((long)noOfPixels << 2);
    im->style = piVar2;
    if (im->style != (int *)0x0) {
      memcpy(im->style,style,(long)noOfPixels << 2);
      im->styleLength = noOfPixels;
      im->stylePos = 0;
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageSetStyle (gdImagePtr im, int *style, int noOfPixels)
{
	if (im->style) {
		gdFree (im->style);
	}
	if (overflow2(sizeof (int), noOfPixels)) {
		return;
	}
	im->style = (int *) gdMalloc (sizeof (int) * noOfPixels);
	if (!im->style) {
		return;
	}
	memcpy (im->style, style, sizeof (int) * noOfPixels);
	im->styleLength = noOfPixels;
	im->stylePos = 0;
}